

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O0

RPCHelpMan * wallet::importprivkey(void)

{
  initializer_list<RPCArg> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff378;
  RPCArg *this;
  UniValue *in_stack_fffffffffffff380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3b0;
  UniValue *in_stack_fffffffffffff3b8;
  undefined1 *puVar2;
  iterator in_stack_fffffffffffff3c0;
  RPCArgOptions *in_stack_fffffffffffff3c8;
  string *in_stack_fffffffffffff3d0;
  Fallback *in_stack_fffffffffffff3d8;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff3e0;
  string *in_stack_fffffffffffff3e8;
  RPCArg *in_stack_fffffffffffff3f0;
  RPCResults *in_stack_fffffffffffff3f8;
  RPCResult *in_stack_fffffffffffff400;
  RPCExamples *examples;
  RPCResults *in_stack_fffffffffffff4c8;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_fffffffffffff4d0;
  RPCHelpMan *description;
  string *in_stack_fffffffffffff4e0;
  _Alloc_hider in_stack_fffffffffffff4e8;
  allocator<char> local_af2;
  allocator<char> local_af1;
  allocator<char> local_af0;
  allocator<char> local_aef;
  allocator<char> local_aee;
  allocator<char> local_aed;
  allocator<char> local_aec;
  allocator<char> local_aeb;
  allocator<char> local_aea;
  allocator<char> local_ae9;
  pointer local_ae8;
  pointer pRStack_ae0;
  undefined1 local_ad8 [23];
  allocator<char> local_ac1 [26];
  allocator<char> local_aa7 [2];
  allocator<char> local_aa5;
  allocator<char> local_aa4;
  allocator<char> local_aa3;
  allocator<char> local_aa2;
  allocator<char> local_aa1 [8];
  allocator<char> local_a99 [31];
  allocator<char> local_a7a;
  allocator<char> local_a79 [89];
  pointer in_stack_fffffffffffff5e0;
  undefined1 local_360 [792];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  description = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3c8,(char *)in_stack_fffffffffffff3c0,
             (allocator<char> *)in_stack_fffffffffffff3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3c8,(char *)in_stack_fffffffffffff3c0,
             (allocator<char> *)in_stack_fffffffffffff3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3c8,(char *)in_stack_fffffffffffff3c0,
             (allocator<char> *)in_stack_fffffffffffff3b8);
  local_aa1[1] = (allocator<char>)0x0;
  local_aa1[2] = (allocator<char>)0x0;
  local_aa1[3] = (allocator<char>)0x0;
  local_aa1[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff388,&in_stack_fffffffffffff380->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3c8,(char *)in_stack_fffffffffffff3c0,
             (allocator<char> *)in_stack_fffffffffffff3b8);
  std::__cxx11::string::string(in_stack_fffffffffffff390);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff378);
  RPCArg::RPCArg(in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8,
                 (Type)((ulong)in_stack_fffffffffffff3e0 >> 0x20),in_stack_fffffffffffff3d8,
                 in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3c8,(char *)in_stack_fffffffffffff3c0,
             (allocator<char> *)in_stack_fffffffffffff3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3c8,(char *)in_stack_fffffffffffff3c0,
             (allocator<char> *)in_stack_fffffffffffff3b8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff388,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff380);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3c8,(char *)in_stack_fffffffffffff3c0,
             (allocator<char> *)in_stack_fffffffffffff3b8);
  std::__cxx11::string::string(in_stack_fffffffffffff390);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff378);
  RPCArg::RPCArg(in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8,
                 (Type)((ulong)in_stack_fffffffffffff3e0 >> 0x20),in_stack_fffffffffffff3d8,
                 in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3c8,(char *)in_stack_fffffffffffff3c0,
             (allocator<char> *)in_stack_fffffffffffff3b8);
  local_aa7[1] = (allocator<char>)0x1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_fffffffffffff3b8,(bool *)in_stack_fffffffffffff3b0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff388,in_stack_fffffffffffff380);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3c8,(char *)in_stack_fffffffffffff3c0,
             (allocator<char> *)in_stack_fffffffffffff3b8);
  std::__cxx11::string::string(in_stack_fffffffffffff390);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff378);
  RPCArg::RPCArg(in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8,
                 (Type)((ulong)in_stack_fffffffffffff3e0 >> 0x20),in_stack_fffffffffffff3d8,
                 in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff3d8 >> 0x38);
  examples = (RPCExamples *)0x3;
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff378);
  __l._M_len = (size_type)in_stack_fffffffffffff3c8;
  __l._M_array = in_stack_fffffffffffff3c0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff3b8,__l,
             (allocator_type *)in_stack_fffffffffffff3b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3c8,(char *)in_stack_fffffffffffff3c0,
             (allocator<char> *)in_stack_fffffffffffff3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3c8,(char *)in_stack_fffffffffffff3c0,
             (allocator<char> *)in_stack_fffffffffffff3b8);
  local_ae8 = (pointer)0x0;
  pRStack_ae0 = (pointer)0x0;
  local_ad8._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff378);
  RPCResult::RPCResult
            (in_stack_fffffffffffff400,(Type)((ulong)in_stack_fffffffffffff3f8 >> 0x20),
             &in_stack_fffffffffffff3f0->m_names,in_stack_fffffffffffff3e8,in_stack_fffffffffffff3e0
             ,(bool)skip_type_check);
  RPCResults::RPCResults(in_stack_fffffffffffff3f8,(RPCResult *)in_stack_fffffffffffff3f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3c8,(char *)in_stack_fffffffffffff3c0,
             (allocator<char> *)in_stack_fffffffffffff3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3c8,(char *)in_stack_fffffffffffff3c0,
             (allocator<char> *)in_stack_fffffffffffff3b8);
  HelpExampleCli(in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
  std::operator+((char *)in_stack_fffffffffffff390,in_stack_fffffffffffff388);
  std::operator+(in_stack_fffffffffffff390,(char *)in_stack_fffffffffffff388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3c8,(char *)in_stack_fffffffffffff3c0,
             (allocator<char> *)in_stack_fffffffffffff3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3c8,(char *)in_stack_fffffffffffff3c0,
             (allocator<char> *)in_stack_fffffffffffff3b8);
  HelpExampleCli(in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
  std::operator+(in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
  std::operator+(in_stack_fffffffffffff390,(char *)in_stack_fffffffffffff388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3c8,(char *)in_stack_fffffffffffff3c0,
             (allocator<char> *)in_stack_fffffffffffff3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3c8,(char *)in_stack_fffffffffffff3c0,
             (allocator<char> *)in_stack_fffffffffffff3b8);
  HelpExampleCli(in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
  std::operator+(in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
  std::operator+(in_stack_fffffffffffff390,(char *)in_stack_fffffffffffff388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3c8,(char *)in_stack_fffffffffffff3c0,
             (allocator<char> *)in_stack_fffffffffffff3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3c8,(char *)in_stack_fffffffffffff3c0,
             (allocator<char> *)in_stack_fffffffffffff3b8);
  HelpExampleCli(in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
  std::operator+(in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
  std::operator+(in_stack_fffffffffffff390,(char *)in_stack_fffffffffffff388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3c8,(char *)in_stack_fffffffffffff3c0,
             (allocator<char> *)in_stack_fffffffffffff3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3c8,(char *)in_stack_fffffffffffff3c0,
             (allocator<char> *)in_stack_fffffffffffff3b8);
  HelpExampleRpc(in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
  std::operator+(in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff378,(string *)0x15be174);
  this = (RPCArg *)&stack0xfffffffffffff4e8;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::importprivkey()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_fffffffffffff388,(anon_class_1_0_00000001 *)in_stack_fffffffffffff380);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)in_stack_fffffffffffff4e8._M_p,in_stack_fffffffffffff4e0,
             &description->m_name,in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8,examples,
             (RPCMethodImpl *)in_stack_fffffffffffff5e0);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_af2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_af1);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_af0);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_aef);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_aee);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_aed);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_aec);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_aeb);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_aea);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_ae9);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff388);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_ad8 + 0x16));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_ac1);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff388);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_360;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_aa7);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_aa5);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_aa4);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_aa3);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_aa2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_aa1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_a99);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_a7a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_a79);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan importprivkey()
{
    return RPCHelpMan{"importprivkey",
                "\nAdds a private key (as returned by dumpprivkey) to your wallet. Requires a new wallet backup.\n"
                "Hint: use importmulti to import more than one private key.\n"
            "\nNote: This call can take over an hour to complete if rescan is true, during that time, other rpc calls\n"
            "may report that the imported key exists but related transactions are still missing, leading to temporarily incorrect/bogus balances and unspent outputs until rescan completes.\n"
            "The rescan parameter can be set to false if the key was never used to create transactions. If it is set to false,\n"
            "but the key was used to create transactions, rescanblockchain needs to be called with the appropriate block range.\n"
            "Note: Use \"getwalletinfo\" to query the scanning progress.\n"
            "Note: This command is only compatible with legacy wallets. Use \"importdescriptors\" with \"combo(X)\" for descriptor wallets.\n",
                {
                    {"privkey", RPCArg::Type::STR, RPCArg::Optional::NO, "The private key (see dumpprivkey)"},
                    {"label", RPCArg::Type::STR, RPCArg::DefaultHint{"current label if address exists, otherwise \"\""}, "An optional label"},
                    {"rescan", RPCArg::Type::BOOL, RPCArg::Default{true}, "Scan the chain and mempool for wallet transactions."},
                },
                RPCResult{RPCResult::Type::NONE, "", ""},
                RPCExamples{
            "\nDump a private key\n"
            + HelpExampleCli("dumpprivkey", "\"myaddress\"") +
            "\nImport the private key with rescan\n"
            + HelpExampleCli("importprivkey", "\"mykey\"") +
            "\nImport using a label and without rescan\n"
            + HelpExampleCli("importprivkey", "\"mykey\" \"testing\" false") +
            "\nImport using default blank label and without rescan\n"
            + HelpExampleCli("importprivkey", "\"mykey\" \"\" false") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("importprivkey", "\"mykey\", \"testing\", false")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    if (pwallet->IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Cannot import private keys to a wallet with private keys disabled");
    }

    EnsureLegacyScriptPubKeyMan(*pwallet, true);

    WalletRescanReserver reserver(*pwallet);
    bool fRescan = true;
    {
        LOCK(pwallet->cs_wallet);

        EnsureWalletIsUnlocked(*pwallet);

        std::string strSecret = request.params[0].get_str();
        const std::string strLabel{LabelFromValue(request.params[1])};

        // Whether to perform rescan after import
        if (!request.params[2].isNull())
            fRescan = request.params[2].get_bool();

        if (fRescan && pwallet->chain().havePruned()) {
            // Exit early and print an error.
            // If a block is pruned after this check, we will import the key(s),
            // but fail the rescan with a generic error.
            throw JSONRPCError(RPC_WALLET_ERROR, "Rescan is disabled when blocks are pruned");
        }

        if (fRescan && !reserver.reserve()) {
            throw JSONRPCError(RPC_WALLET_ERROR, "Wallet is currently rescanning. Abort existing rescan or wait.");
        }

        CKey key = DecodeSecret(strSecret);
        if (!key.IsValid()) throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid private key encoding");

        CPubKey pubkey = key.GetPubKey();
        CHECK_NONFATAL(key.VerifyPubKey(pubkey));
        CKeyID vchAddress = pubkey.GetID();
        {
            pwallet->MarkDirty();

            // We don't know which corresponding address will be used;
            // label all new addresses, and label existing addresses if a
            // label was passed.
            for (const auto& dest : GetAllDestinationsForKey(pubkey)) {
                if (!request.params[1].isNull() || !pwallet->FindAddressBookEntry(dest)) {
                    pwallet->SetAddressBook(dest, strLabel, AddressPurpose::RECEIVE);
                }
            }

            // Use timestamp of 1 to scan the whole chain
            if (!pwallet->ImportPrivKeys({{vchAddress, key}}, 1)) {
                throw JSONRPCError(RPC_WALLET_ERROR, "Error adding key to wallet");
            }

            // Add the wpkh script for this key if possible
            if (pubkey.IsCompressed()) {
                pwallet->ImportScripts({GetScriptForDestination(WitnessV0KeyHash(vchAddress))}, /*timestamp=*/0);
            }
        }
    }
    if (fRescan) {
        RescanWallet(*pwallet, reserver);
    }

    return UniValue::VNULL;
},
    };
}